

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pss_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *pmVar3;
  ulong __n_00;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uchar *input;
  mbedtls_md_context_t md_ctx;
  uchar salt [64];
  mbedtls_md_context_t local_90;
  uchar local_78 [72];
  
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 1) {
      return -0x4080;
    }
LAB_0012182d:
    __n = ctx->len;
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar3 = mbedtls_md_info_from_type(md_alg);
      if (pmVar3 == (mbedtls_md_info_t *)0x0) goto LAB_001218c8;
      bVar1 = mbedtls_md_get_size(pmVar3);
      hashlen = (uint)bVar1;
    }
    pmVar3 = mbedtls_md_info_from_type(ctx->hash_id);
    iVar2 = -0x4080;
    if (pmVar3 != (mbedtls_md_info_t *)0x0) {
      bVar1 = mbedtls_md_get_size(pmVar3);
      __n_00 = (ulong)bVar1;
      if ((uint)bVar1 * 2 + 2 <= __n) {
        memset(sig,0,__n);
        iVar2 = (*f_rng)(p_rng,local_78,__n_00);
        if (iVar2 == 0) {
          sVar4 = mbedtls_mpi_bitlen(&ctx->N);
          lVar6 = __n - (uint)bVar1 * 2;
          sig[lVar6 + -2] = '\x01';
          memcpy(sig + lVar6 + -1,local_78,__n_00);
          mbedtls_md_init(&local_90);
          iVar2 = mbedtls_md_setup(&local_90,pmVar3,0);
          if (iVar2 == 0) {
            input = sig + lVar6 + -1 + __n_00;
            mbedtls_md_starts(&local_90);
            mbedtls_md_update(&local_90,input,8);
            mbedtls_md_update(&local_90,hash,(ulong)hashlen);
            mbedtls_md_update(&local_90,local_78,__n_00);
            mbedtls_md_finish(&local_90,input);
            uVar5 = (ulong)(((int)sVar4 - 1U & 7) == 0);
            mgf_mask(sig + uVar5,(~__n_00 + __n) - uVar5,input,__n_00,&local_90);
            mbedtls_md_free(&local_90);
            sVar4 = mbedtls_mpi_bitlen(&ctx->N);
            *sig = *sig & (byte)(0xff >> (((char)__n * '\b' + '\x01') - (char)sVar4 & 0x1fU));
            input[__n_00] = 0xbc;
            if (mode == 0) {
              iVar2 = mbedtls_rsa_public(ctx,sig,sig);
            }
            else {
              iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,sig);
            }
          }
          else {
            mbedtls_md_free(&local_90);
          }
        }
        else {
          iVar2 = iVar2 + -0x4480;
        }
      }
    }
  }
  else {
    if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_0012182d;
LAB_001218c8:
    iVar2 = -0x4080;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsassa_pss_sign( mbedtls_rsa_context *ctx,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng,
                         int mode,
                         mbedtls_md_type_t md_alg,
                         unsigned int hashlen,
                         const unsigned char *hash,
                         unsigned char *sig )
{
    size_t olen;
    unsigned char *p = sig;
    unsigned char salt[MBEDTLS_MD_MAX_SIZE];
    unsigned int slen, hlen, offset = 0;
    int ret;
    size_t msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = hlen;

    if( olen < hlen + slen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    memset( sig, 0, olen );

    /* Generate salt of length slen */
    if( ( ret = f_rng( p_rng, salt, slen ) ) != 0 )
        return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

    /* Note: EMSA-PSS encoding is over the length of N - 1 bits */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    p += olen - hlen * 2 - 2;
    *p++ = 0x01;
    memcpy( p, salt, slen );
    p += slen;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        return( ret );
    }

    /* Generate H = Hash( M' ) */
    mbedtls_md_starts( &md_ctx );
    mbedtls_md_update( &md_ctx, p, 8 );
    mbedtls_md_update( &md_ctx, hash, hashlen );
    mbedtls_md_update( &md_ctx, salt, slen );
    mbedtls_md_finish( &md_ctx, p );

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
        offset = 1;

    /* maskedDB: Apply dbMask to DB */
    mgf_mask( sig + offset, olen - hlen - 1 - offset, p, hlen, &md_ctx );

    mbedtls_md_free( &md_ctx );

    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    sig[0] &= 0xFF >> ( olen * 8 - msb );

    p += hlen;
    *p++ = 0xBC;

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, sig, sig )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig ) );
}